

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O3

int triangle_upper_to_i4(int i,int j)

{
  ostream *poVar1;
  
  if (i < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"TRIANGLE_UPPER_TO_I4 - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  I < 0.\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  I = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
  }
  else if (j < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"TRIANGLE_UPPER_TO_I4 - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  J < 0.\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  J = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,j);
  }
  else {
    if ((uint)i <= (uint)j) {
      return ((uint)((j + 1) * j) >> 1) + i;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"TRIANGLE_UPPER_TO_I4 - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  J < I.\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  I = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  J = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,j);
  }
  std::operator<<(poVar1,"\n");
  exit(1);
}

Assistant:

int triangle_upper_to_i4 ( int i, int j )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE_UPPER_TO_I4 converts an upper triangular coordinate to an integer.
//
//  Discussion:
//
//    Triangular coordinates are handy when storing a naturally triangular
//    array (such as the upper half of a matrix) in a linear array.
//
//    Thus, for example, we might consider storing
//
//    (0,0) (0,1) (0,2) (0,3)
//          (1,1) (1,2) (1,3)
//                (2,2) (2,3)
//                      (3,3)
//
//    as the linear array
//
//    (0,0) (0,1) (1,1) (0,2) (1,2) (2,2) (0,3) (1,3) (2,3) (3,3)
//
//    Here, the quantities in parenthesis represent the natural row and
//    column indices of a single number when stored in a rectangular array.
//
//    Thus, our goal is, given the row I and column J of the data,
//    to produce the value K which indicates its position in the linear
//    array.
//
//    The triangular numbers are the indices associated with the
//    diagonal elements of the original array, T(0,0), T(1,1), T(2,2), 
//    T(3,3) and so on.
//
//    The formula is:
//
//      K = I + ( ( J * ( J + 1 ) ) / 2
//
//  Example:
//
//    I  J  K
//
//    0  0  0
//    0  1  1
//    1  1  2
//    0  2  3
//    1  2  4
//    2  2  5
//    0  3  6
//    1  3  7
//    2  3  8
//    3  3  9
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    23 March 2017
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int I, J, the row and column indices.  I and J must
//    be nonnegative, and I must not be greater than J.
//
//    Output, int TRIANGLE_UPPER_TO_I4, the linear index of the (I,J) element.
//
{
  int value;

  if ( i < 0 )
  {
    cerr << "\n";
    cerr << "TRIANGLE_UPPER_TO_I4 - Fatal error!\n";
    cerr << "  I < 0.\n";
    cerr << "  I = " << i << "\n";
    exit ( 1 );
  }
  else if ( j < 0 )
  {
    cerr << "\n";
    cerr << "TRIANGLE_UPPER_TO_I4 - Fatal error!\n";
    cerr << "  J < 0.\n";
    cerr << "  J = " << j << "\n";
    exit ( 1 );
  }
  else if ( j < i )
  {
    cerr << "\n";
    cerr << "TRIANGLE_UPPER_TO_I4 - Fatal error!\n";
    cerr << "  J < I.\n";
    cerr << "  I = " << i << "\n";
    cerr << "  J = " << j << "\n";
    exit ( 1 );
  }

  value = i + (  j * ( j + 1 ) ) / 2;

  return value;
}